

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O2

int SUNNonlinSolFree(SUNNonlinearSolver NLS)

{
  int iVar1;
  _generic_SUNNonlinearSolver_Ops *__ptr;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    return 0;
  }
  __ptr = NLS->ops;
  if (__ptr == (_generic_SUNNonlinearSolver_Ops *)0x0) {
    return 0;
  }
  if (__ptr->free != (_func_int_SUNNonlinearSolver *)0x0) {
    iVar1 = (*__ptr->free)(NLS);
    return iVar1;
  }
  if (NLS->content != (void *)0x0) {
    free(NLS->content);
    NLS->content = (void *)0x0;
    __ptr = NLS->ops;
    if (__ptr == (_generic_SUNNonlinearSolver_Ops *)0x0) goto LAB_00103c27;
  }
  free(__ptr);
LAB_00103c27:
  free(NLS);
  return 0;
}

Assistant:

int SUNNonlinSolFree(SUNNonlinearSolver NLS)
{
  if (NLS == NULL) return(SUN_NLS_SUCCESS);
  if (NLS->ops == NULL) return(SUN_NLS_SUCCESS);

  if (NLS->ops->free) {
    return(NLS->ops->free(NLS));
  } else {
    /* free the content structure */
    if (NLS->content) {
      free(NLS->content);
      NLS->content = NULL;
    }
    /* free the ops structure */
    if (NLS->ops) {
      free(NLS->ops);
      NLS->ops = NULL;
    }
    /* free the nonlinear solver */
    free(NLS);
    return(SUN_NLS_SUCCESS);
  }
}